

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet_decoder.c
# Opt level: O0

int pt_pkt_sync_backward(pt_packet_decoder *decoder)

{
  uint8_t *puStack_28;
  int errcode;
  uint8_t *sync;
  uint8_t *pos;
  pt_packet_decoder *decoder_local;
  
  if (decoder == (pt_packet_decoder *)0x0) {
    decoder_local._4_4_ = -2;
  }
  else {
    sync = decoder->pos;
    if (sync == (uint8_t *)0x0) {
      sync = (decoder->config).end;
    }
    pos = (uint8_t *)decoder;
    decoder_local._4_4_ = pt_sync_backward(&stack0xffffffffffffffd8,sync,&decoder->config);
    if (-1 < decoder_local._4_4_) {
      *(uint8_t **)(pos + 0x120) = puStack_28;
      *(uint8_t **)(pos + 0x118) = puStack_28;
      decoder_local._4_4_ = 0;
    }
  }
  return decoder_local._4_4_;
}

Assistant:

int pt_pkt_sync_backward(struct pt_packet_decoder *decoder)
{
	const uint8_t *pos, *sync;
	int errcode;

	if (!decoder)
		return -pte_invalid;

	pos = decoder->pos;
	if (!pos)
		pos = decoder->config.end;

	errcode = pt_sync_backward(&sync, pos, &decoder->config);
	if (errcode < 0)
		return errcode;

	decoder->sync = sync;
	decoder->pos = sync;

	return 0;
}